

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

void Minisat::skipWhitespace<Minisat::StreamBuffer>(StreamBuffer *in)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = in->pos;
  bVar1 = iVar2 < in->size;
  if (iVar2 < in->size) {
    do {
      if ((in->buf[iVar2] < 9) || ((bVar1 && (0xd < in->buf[iVar2])))) {
        if (!bVar1) {
          return;
        }
        if (in->buf[iVar2] != ' ') {
          return;
        }
      }
      in->pos = iVar2 + 1;
      StreamBuffer::assureLookahead(in);
      iVar2 = in->pos;
      bVar1 = iVar2 < in->size;
    } while (iVar2 < in->size);
  }
  return;
}

Assistant:

int  operator *  () const { return (pos >= size) ? EOF : buf[pos]; }